

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

string * __thiscall
pbrt::TriangleFilter::ToString_abi_cxx11_(string *__return_storage_ptr__,TriangleFilter *this)

{
  Vector2<float> *in_RCX;
  
  StringPrintf<pbrt::Vector2<float>const&>
            (__return_storage_ptr__,(pbrt *)"[ TriangleFilter radius: %s ]",(char *)this,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string TriangleFilter::ToString() const {
    return StringPrintf("[ TriangleFilter radius: %s ]", radius);
}